

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O1

void __thiscall
Imf_3_2::TiledRgbaInputFile::TiledRgbaInputFile
          (TiledRgbaInputFile *this,char *name,string *layerName,int numThreads)

{
  RgbaChannels RVar1;
  TiledInputFile *this_00;
  Header *header;
  FromYa *this_01;
  
  this->_vptr_TiledRgbaInputFile = (_func_int **)&PTR__TiledRgbaInputFile_003d8570;
  this_00 = (TiledInputFile *)operator_new(0x10);
  TiledInputFile::TiledInputFile(this_00,name,numThreads);
  this->_inputFile = this_00;
  this->_fromYa = (FromYa *)0x0;
  header = TiledInputFile::header(this_00);
  anon_unknown_22::prefixFromLayerName(&this->_channelNamePrefix,layerName,header);
  RVar1 = channels(this);
  if (WRITE_RGBA < RVar1) {
    this_01 = (FromYa *)operator_new(0x50);
    FromYa::FromYa(this_01,this->_inputFile);
    this->_fromYa = this_01;
  }
  return;
}

Assistant:

TiledRgbaInputFile::TiledRgbaInputFile (
    const char name[], const string& layerName, int numThreads)
    : _inputFile (new TiledInputFile (name, numThreads))
    , _fromYa (0)
    , _channelNamePrefix (
          prefixFromLayerName (layerName, _inputFile->header ()))
{
    if (channels () & WRITE_Y) _fromYa = new FromYa (*_inputFile);
}